

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureValueWeight *this)

{
  long lVar1;
  BayesianProbitRegressor_Gaussian *pBVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  
  pBVar2 = this->featureweight_;
  if (pBVar2 == (BayesianProbitRegressor_Gaussian *)0x0 ||
      this == (BayesianProbitRegressor_FeatureValueWeight *)
              &_BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    sVar5 = 0;
  }
  else {
    uVar7 = (ulong)(-(uint)(pBVar2->mean_ != 0.0) & 1);
    lVar1 = uVar7 * 9 + 9;
    lVar4 = uVar7 * 9;
    if (pBVar2->precision_ != 0.0) {
      lVar4 = lVar1;
    }
    if (NAN(pBVar2->precision_)) {
      lVar4 = lVar1;
    }
    pBVar2->_cached_size_ = (int)lVar4;
    sVar5 = lVar4 + 2;
  }
  if (this->featurevalue_ != 0) {
    uVar6 = this->featurevalue_ | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar5 = sVar5 + (iVar3 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

inline bool BayesianProbitRegressor_FeatureValueWeight::has_featureweight() const {
  return this != internal_default_instance() && featureweight_ != NULL;
}